

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getRelativeTransform
          (KinDynComputations *this,string *refFrameName,string *frameName,
          MatrixView<double> *refFrame_H_frame)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  MatrixView<double> local_50;
  
  iVar2 = getFrameIndex(this,refFrameName);
  iVar3 = getFrameIndex(this,frameName);
  if (FRAME_INVALID_INDEX == iVar3) {
    pcVar4 = "unknown frameName";
  }
  else {
    if (FRAME_INVALID_INDEX != iVar2) {
      local_50.m_storage = refFrame_H_frame->m_storage;
      local_50.m_rows = refFrame_H_frame->m_rows;
      local_50.m_cols = refFrame_H_frame->m_cols;
      local_50.m_storageOrder = refFrame_H_frame->m_storageOrder;
      local_50.m_innerStride = refFrame_H_frame->m_innerStride;
      local_50.m_outerStride = refFrame_H_frame->m_outerStride;
      bVar1 = getRelativeTransform(this,(long)iVar2,(long)iVar3,&local_50);
      return bVar1;
    }
    pcVar4 = "unknown refFrameName";
  }
  iDynTree::reportError("KinDynComputations","getRelativeTransform",pcVar4);
  return false;
}

Assistant:

bool KinDynComputations::getRelativeTransform(const std::string & refFrameName,
                                              const std::string & frameName,
                                              iDynTree::MatrixView<double> refFrame_H_frame)
{
    const int refFrameIndex = getFrameIndex(refFrameName);
    const int frameIndex = getFrameIndex(frameName);
    if( frameIndex == iDynTree::FRAME_INVALID_INDEX )
    {
        reportError("KinDynComputations","getRelativeTransform","unknown frameName");
        return false;
    }
    else if( refFrameIndex == iDynTree::FRAME_INVALID_INDEX )
    {
        reportError("KinDynComputations","getRelativeTransform","unknown refFrameName");
        return false;
    }
    else
    {
        return this->getRelativeTransform(refFrameIndex,frameIndex, refFrame_H_frame);
    }
}